

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFlattenLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  allocator local_81;
  undefined1 local_80 [40];
  string local_58;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_80,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_80,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if ((bVar1) && (this->ndArrayInterpretation == true)) {
    std::__cxx11::string::string((string *)&local_38,"Flatten",(allocator *)&local_58);
    validateInputOutputRankEquality((Result *)local_80,layer,&local_38,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_58,"Flatten",&local_81);
      validateRankCount((Result *)local_80,layer,&local_58,3,-1,&this->blobNameToRank);
      Result::operator=(__return_storage_ptr__,(Result *)local_80);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      std::__cxx11::string::~string((string *)&local_58);
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFlattenLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Flatten", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Flatten", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    return r;
}